

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.c
# Opt level: O0

Raw AllocateObject(Heap *heap,Size userSize)

{
  uint8_t uVar1;
  ulong size_00;
  Chuck *chuck;
  Chuck *selected;
  Size size;
  Size userSize_local;
  Heap *heap_local;
  
  size_00 = userSize + 0xb & 0xfffffffffffffff8;
  chuck = FindSmallestFitInHeap(heap,size_00);
  if (chuck == (Chuck *)0x0) {
    heap_local = (Heap *)0x0;
  }
  else {
    uVar1 = GetUsed(chuck);
    if (uVar1 != '\0') {
      __assert_fail("!GetUsed(selected)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/Heap.c"
                    ,0x35,"Raw AllocateObject(Heap *, Size)");
    }
    AllocateInChuck(heap,chuck,size_00);
    SetUsed(chuck,'\x01');
    heap_local = (Heap *)ToObject(chuck);
  }
  return heap_local;
}

Assistant:

Raw AllocateObject(Heap *heap, Size userSize) {
    Size size = (userSize + OVERHEAD_OF_USED_CHUCK + 0x07) >> 3u << 3u;
    Chuck *selected = FindSmallestFitInHeap(heap, size);
    if (!selected) {
        return NULL;
    }

    assert(!GetUsed(selected));
    AllocateInChuck(heap, selected, size);
    SetUsed(selected, 1);
    return ToObject(selected);
}